

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingInfoWrapper.cpp
# Opt level: O1

void __thiscall
VulkanUtilities::RenderingInfoWrapper::RenderingInfoWrapper
          (RenderingInfoWrapper *this,size_t Hash,uint32_t ColorAttachmentCount,
          bool UseDepthAttachment,bool UseStencilAttachment)

{
  ulong __n;
  VkRenderingAttachmentInfo *__s;
  undefined7 in_register_00000009;
  uint uVar1;
  undefined7 in_register_00000081;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  pointer *__ptr;
  string msg;
  string local_50;
  
  uVar2 = CONCAT71(in_register_00000081,UseStencilAttachment);
  *(undefined8 *)&this->m_RI = 0;
  (this->m_RI).pNext = (void *)0x0;
  (this->m_RI).flags = 0;
  (this->m_RI).renderArea.offset.x = 0;
  *(undefined8 *)&(this->m_RI).renderArea.offset.y = 0;
  *(undefined8 *)&(this->m_RI).renderArea.extent.height = 0;
  (this->m_RI).viewMask = 0;
  (this->m_RI).colorAttachmentCount = 0;
  (this->m_RI).pColorAttachments = (VkRenderingAttachmentInfo *)0x0;
  (this->m_RI).pDepthAttachment = (VkRenderingAttachmentInfo *)0x0;
  uVar5 = 0;
  (this->m_RI).pStencilAttachment = (VkRenderingAttachmentInfo *)0x0;
  this->m_Hash = Hash;
  (this->m_Attachments)._M_t.
  super___uniq_ptr_impl<VkRenderingAttachmentInfo,_std::default_delete<VkRenderingAttachmentInfo[]>_>
  ._M_t.
  super__Tuple_impl<0UL,_VkRenderingAttachmentInfo_*,_std::default_delete<VkRenderingAttachmentInfo[]>_>
  .super__Head_base<0UL,_VkRenderingAttachmentInfo_*,_false>._M_head_impl =
       (VkRenderingAttachmentInfo *)0x0;
  (this->m_ShadingRateAttachment)._M_t.
  super___uniq_ptr_impl<VkRenderingFragmentShadingRateAttachmentInfoKHR,_std::default_delete<VkRenderingFragmentShadingRateAttachmentInfoKHR>_>
  ._M_t.
  super__Tuple_impl<0UL,_VkRenderingFragmentShadingRateAttachmentInfoKHR_*,_std::default_delete<VkRenderingFragmentShadingRateAttachmentInfoKHR>_>
  .super__Head_base<0UL,_VkRenderingFragmentShadingRateAttachmentInfoKHR_*,_false>._M_head_impl =
       (VkRenderingFragmentShadingRateAttachmentInfoKHR *)0x0;
  this->m_DepthAttachmentIndex = 0xffffffff;
  this->m_StencilAttachmentIndex = 0xffffffff;
  this->m_AttachmentClearMask = 0;
  (this->m_RI).sType = VK_STRUCTURE_TYPE_RENDERING_INFO;
  (this->m_RI).pNext = (void *)0x0;
  (this->m_RI).flags = 0;
  (this->m_RI).colorAttachmentCount = ColorAttachmentCount;
  uVar1 = (int)(char (*) [38])CONCAT71(in_register_00000009,UseDepthAttachment) +
          ColorAttachmentCount + (int)uVar2;
  if (uVar1 != 0) {
    __n = (ulong)uVar1 * 0x48;
    __s = (VkRenderingAttachmentInfo *)operator_new__(__n);
    uVar3 = 0;
    memset(__s,0,__n);
    (this->m_Attachments)._M_t.
    super___uniq_ptr_impl<VkRenderingAttachmentInfo,_std::default_delete<VkRenderingAttachmentInfo[]>_>
    ._M_t.
    super__Tuple_impl<0UL,_VkRenderingAttachmentInfo_*,_std::default_delete<VkRenderingAttachmentInfo[]>_>
    .super__Head_base<0UL,_VkRenderingAttachmentInfo_*,_false>._M_head_impl = __s;
    uVar2 = uVar2 & 0xffffffff;
    do {
      *(undefined4 *)((long)&__s->sType + uVar3) = 0x3b9b75e1;
      uVar3 = uVar3 + 0x48;
    } while (__n != uVar3);
  }
  if (ColorAttachmentCount != 0) {
    (this->m_RI).pColorAttachments =
         (this->m_Attachments)._M_t.
         super___uniq_ptr_impl<VkRenderingAttachmentInfo,_std::default_delete<VkRenderingAttachmentInfo[]>_>
         ._M_t.
         super__Tuple_impl<0UL,_VkRenderingAttachmentInfo_*,_std::default_delete<VkRenderingAttachmentInfo[]>_>
         .super__Head_base<0UL,_VkRenderingAttachmentInfo_*,_false>._M_head_impl;
    uVar5 = (ulong)ColorAttachmentCount;
  }
  if (UseDepthAttachment) {
    this->m_DepthAttachmentIndex = (uint32_t)uVar5;
    (this->m_RI).pDepthAttachment =
         (this->m_Attachments)._M_t.
         super___uniq_ptr_impl<VkRenderingAttachmentInfo,_std::default_delete<VkRenderingAttachmentInfo[]>_>
         ._M_t.
         super__Tuple_impl<0UL,_VkRenderingAttachmentInfo_*,_std::default_delete<VkRenderingAttachmentInfo[]>_>
         .super__Head_base<0UL,_VkRenderingAttachmentInfo_*,_false>._M_head_impl + uVar5;
    uVar5 = (ulong)((uint32_t)uVar5 + 1);
  }
  uVar4 = (uint)uVar5;
  if ((char)uVar2 != '\0') {
    this->m_StencilAttachmentIndex = uVar4;
    (this->m_RI).pStencilAttachment =
         (this->m_Attachments)._M_t.
         super___uniq_ptr_impl<VkRenderingAttachmentInfo,_std::default_delete<VkRenderingAttachmentInfo[]>_>
         ._M_t.
         super__Tuple_impl<0UL,_VkRenderingAttachmentInfo_*,_std::default_delete<VkRenderingAttachmentInfo[]>_>
         .super__Head_base<0UL,_VkRenderingAttachmentInfo_*,_false>._M_head_impl + uVar5;
    uVar4 = uVar4 + 1;
  }
  if (uVar4 != uVar1) {
    Diligent::FormatString<char[26],char[38]>
              (&local_50,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"AttachmentInd == TotalAttachmentCount",
               (char (*) [38])CONCAT71(in_register_00000009,UseDepthAttachment));
    Diligent::DebugAssertionFailed
              (local_50._M_dataplus._M_p,"RenderingInfoWrapper",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/VulkanUtilities/RenderingInfoWrapper.cpp"
               ,0x48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

RenderingInfoWrapper::RenderingInfoWrapper(size_t   Hash,
                                           uint32_t ColorAttachmentCount,
                                           bool     UseDepthAttachment,
                                           bool     UseStencilAttachment) :
    m_RI{},
    m_Hash{Hash}
{
    m_RI.sType                = VK_STRUCTURE_TYPE_RENDERING_INFO_KHR;
    m_RI.pNext                = nullptr;
    m_RI.flags                = 0;
    m_RI.colorAttachmentCount = ColorAttachmentCount;

    const uint32_t TotalAttachmentCount = ColorAttachmentCount + (UseDepthAttachment ? 1u : 0u) + (UseStencilAttachment ? 1u : 0u);
    if (TotalAttachmentCount > 0)
    {
        m_Attachments = std::make_unique<VkRenderingAttachmentInfo[]>(TotalAttachmentCount);
        for (size_t i = 0; i < TotalAttachmentCount; ++i)
            m_Attachments[i].sType = VK_STRUCTURE_TYPE_RENDERING_ATTACHMENT_INFO_KHR;
    }
    uint32_t AttachmentInd = 0;
    if (ColorAttachmentCount > 0)
    {
        m_RI.pColorAttachments = &m_Attachments[AttachmentInd];
        AttachmentInd += ColorAttachmentCount;
    }
    if (UseDepthAttachment)
    {
        m_DepthAttachmentIndex = AttachmentInd;
        m_RI.pDepthAttachment  = &m_Attachments[AttachmentInd];
        ++AttachmentInd;
    }
    if (UseStencilAttachment)
    {
        m_StencilAttachmentIndex = AttachmentInd;
        m_RI.pStencilAttachment  = &m_Attachments[AttachmentInd];
        ++AttachmentInd;
    }
    VERIFY_EXPR(AttachmentInd == TotalAttachmentCount);
}